

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O0

GLboolean glxewIsSupported(char *name)

{
  GLboolean GVar1;
  GLboolean local_1d;
  GLuint local_1c;
  GLboolean ret;
  GLubyte *pGStack_18;
  GLuint len;
  GLubyte *pos;
  char *name_local;
  
  pGStack_18 = (GLubyte *)name;
  pos = (GLubyte *)name;
  local_1c = _glewStrLen((GLubyte *)name);
  local_1d = '\x01';
LAB_002ab7e4:
  if (local_1d == '\0' || local_1c == 0) {
    return local_1d;
  }
  GVar1 = _glewStrSame1(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"GLX_",4);
  if (GVar1 != '\0') {
    GVar1 = _glewStrSame2(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"VERSION_",8);
    if (GVar1 != '\0') {
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"1_2",3);
      if (GVar1 == '\0') {
        GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"1_3",3);
        if (GVar1 == '\0') {
          GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"1_4",3);
          if (GVar1 == '\0') goto LAB_002ab8cd;
          local_1d = __GLXEW_VERSION_1_4;
        }
        else {
          local_1d = __GLXEW_VERSION_1_3;
        }
      }
      else {
        local_1d = __GLXEW_VERSION_1_2;
      }
      goto LAB_002ab7e4;
    }
LAB_002ab8cd:
    GVar1 = _glewStrSame2(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"3DFX_",5);
    if ((GVar1 != '\0') &&
       (GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"multisample",0xb), GVar1 != '\0'))
    {
      local_1d = __GLXEW_3DFX_multisample;
      goto LAB_002ab7e4;
    }
    GVar1 = _glewStrSame2(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"AMD_",4);
    if ((GVar1 != '\0') &&
       (GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"gpu_association",0xf),
       GVar1 != '\0')) {
      local_1d = __GLXEW_AMD_gpu_association;
      goto LAB_002ab7e4;
    }
    GVar1 = _glewStrSame2(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"ARB_",4);
    if (GVar1 != '\0') {
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"context_flush_control",0x15);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_ARB_context_flush_control;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"create_context",0xe);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_ARB_create_context;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"create_context_profile",0x16);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_ARB_create_context_profile;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"create_context_robustness",0x19);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_ARB_create_context_robustness;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"fbconfig_float",0xe);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_ARB_fbconfig_float;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"framebuffer_sRGB",0x10);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_ARB_framebuffer_sRGB;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"get_proc_address",0x10);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_ARB_get_proc_address;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"multisample",0xb);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_ARB_multisample;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"robustness_application_isolation",
                            0x20);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_ARB_robustness_application_isolation;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"robustness_share_group_isolation",
                            0x20);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_ARB_robustness_share_group_isolation;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"vertex_buffer_object",0x14);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_ARB_vertex_buffer_object;
        goto LAB_002ab7e4;
      }
    }
    GVar1 = _glewStrSame2(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"ATI_",4);
    if (GVar1 != '\0') {
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"pixel_format_float",0x12);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_ATI_pixel_format_float;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"render_texture",0xe);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_ATI_render_texture;
        goto LAB_002ab7e4;
      }
    }
    GVar1 = _glewStrSame2(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"EXT_",4);
    if (GVar1 != '\0') {
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"buffer_age",10);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_EXT_buffer_age;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"create_context_es2_profile",0x1a);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_EXT_create_context_es2_profile;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"create_context_es_profile",0x19);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_EXT_create_context_es_profile;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"fbconfig_packed_float",0x15);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_EXT_fbconfig_packed_float;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"framebuffer_sRGB",0x10);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_EXT_framebuffer_sRGB;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"import_context",0xe);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_EXT_import_context;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"scene_marker",0xc);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_EXT_scene_marker;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"stereo_tree",0xb);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_EXT_stereo_tree;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"swap_control",0xc);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_EXT_swap_control;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"swap_control_tear",0x11);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_EXT_swap_control_tear;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"texture_from_pixmap",0x13);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_EXT_texture_from_pixmap;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"visual_info",0xb);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_EXT_visual_info;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"visual_rating",0xd);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_EXT_visual_rating;
        goto LAB_002ab7e4;
      }
    }
    GVar1 = _glewStrSame2(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"INTEL_",6);
    if ((GVar1 != '\0') &&
       (GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"swap_event",10), GVar1 != '\0')) {
      local_1d = __GLXEW_INTEL_swap_event;
      goto LAB_002ab7e4;
    }
    GVar1 = _glewStrSame2(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"MESA_",5);
    if (GVar1 != '\0') {
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"agp_offset",10);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_MESA_agp_offset;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"copy_sub_buffer",0xf);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_MESA_copy_sub_buffer;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"pixmap_colormap",0xf);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_MESA_pixmap_colormap;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"query_renderer",0xe);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_MESA_query_renderer;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"release_buffers",0xf);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_MESA_release_buffers;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"set_3dfx_mode",0xd);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_MESA_set_3dfx_mode;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"swap_control",0xc);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_MESA_swap_control;
        goto LAB_002ab7e4;
      }
    }
    GVar1 = _glewStrSame2(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"NV_",3);
    if (GVar1 != '\0') {
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"copy_buffer",0xb);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_NV_copy_buffer;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"copy_image",10);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_NV_copy_image;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"delay_before_swap",0x11);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_NV_delay_before_swap;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"float_buffer",0xc);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_NV_float_buffer;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"multisample_coverage",0x14);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_NV_multisample_coverage;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"present_video",0xd);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_NV_present_video;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"swap_group",10);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_NV_swap_group;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"vertex_array_range",0x12);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_NV_vertex_array_range;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"video_capture",0xd);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_NV_video_capture;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"video_out",9);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_NV_video_out;
        goto LAB_002ab7e4;
      }
    }
    GVar1 = _glewStrSame2(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"OML_",4);
    if (GVar1 != '\0') {
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"swap_method",0xb);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_OML_swap_method;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"sync_control",0xc);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_OML_sync_control;
        goto LAB_002ab7e4;
      }
    }
    GVar1 = _glewStrSame2(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"SGIS_",5);
    if (GVar1 != '\0') {
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"blended_overlay",0xf);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_SGIS_blended_overlay;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"color_range",0xb);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_SGIS_color_range;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"multisample",0xb);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_SGIS_multisample;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"shared_multisample",0x12);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_SGIS_shared_multisample;
        goto LAB_002ab7e4;
      }
    }
    GVar1 = _glewStrSame2(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"SGIX_",5);
    if (GVar1 != '\0') {
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"fbconfig",8);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_SGIX_fbconfig;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"hyperpipe",9);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_SGIX_hyperpipe;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"pbuffer",7);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_SGIX_pbuffer;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"swap_barrier",0xc);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_SGIX_swap_barrier;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"swap_group",10);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_SGIX_swap_group;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"video_resize",0xc);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_SGIX_video_resize;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"visual_select_group",0x13);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_SGIX_visual_select_group;
        goto LAB_002ab7e4;
      }
    }
    GVar1 = _glewStrSame2(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"SGI_",4);
    if (GVar1 != '\0') {
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"cushion",7);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_SGI_cushion;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"make_current_read",0x11);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_SGI_make_current_read;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"swap_control",0xc);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_SGI_swap_control;
        goto LAB_002ab7e4;
      }
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"video_sync",10);
      if (GVar1 != '\0') {
        local_1d = __GLXEW_SGI_video_sync;
        goto LAB_002ab7e4;
      }
    }
    GVar1 = _glewStrSame2(&stack0xffffffffffffffe8,&local_1c,(GLubyte *)"SUN_",4);
    if (GVar1 != '\0') {
      GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"get_transparent_index",0x15);
      if (GVar1 == '\0') {
        GVar1 = _glewStrSame3(&stack0xffffffffffffffe8,&local_1c,"video_resize",0xc);
        if (GVar1 == '\0') goto LAB_002ac569;
        local_1d = __GLXEW_SUN_video_resize;
      }
      else {
        local_1d = __GLXEW_SUN_get_transparent_index;
      }
      goto LAB_002ab7e4;
    }
  }
LAB_002ac569:
  local_1d = local_1c == 0;
  goto LAB_002ab7e4;
}

Assistant:

GLboolean glxewIsSupported (const char* name)
#endif
{
  const GLubyte* pos = (const GLubyte*)name;
  GLuint len = _glewStrLen(pos);
  GLboolean ret = GL_TRUE;
  while (ret && len > 0)
  {
    if(_glewStrSame1(&pos, &len, (const GLubyte*)"GLX_", 4))
    {
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"VERSION_", 8))
      {
#ifdef GLX_VERSION_1_2
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"1_2", 3))
        {
          ret = GLXEW_VERSION_1_2;
          continue;
        }
#endif
#ifdef GLX_VERSION_1_3
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"1_3", 3))
        {
          ret = GLXEW_VERSION_1_3;
          continue;
        }
#endif
#ifdef GLX_VERSION_1_4
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"1_4", 3))
        {
          ret = GLXEW_VERSION_1_4;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"3DFX_", 5))
      {
#ifdef GLX_3DFX_multisample
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"multisample", 11))
        {
          ret = GLXEW_3DFX_multisample;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"AMD_", 4))
      {
#ifdef GLX_AMD_gpu_association
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"gpu_association", 15))
        {
          ret = GLXEW_AMD_gpu_association;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"ARB_", 4))
      {
#ifdef GLX_ARB_context_flush_control
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"context_flush_control", 21))
        {
          ret = GLXEW_ARB_context_flush_control;
          continue;
        }
#endif
#ifdef GLX_ARB_create_context
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"create_context", 14))
        {
          ret = GLXEW_ARB_create_context;
          continue;
        }
#endif
#ifdef GLX_ARB_create_context_profile
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"create_context_profile", 22))
        {
          ret = GLXEW_ARB_create_context_profile;
          continue;
        }
#endif
#ifdef GLX_ARB_create_context_robustness
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"create_context_robustness", 25))
        {
          ret = GLXEW_ARB_create_context_robustness;
          continue;
        }
#endif
#ifdef GLX_ARB_fbconfig_float
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"fbconfig_float", 14))
        {
          ret = GLXEW_ARB_fbconfig_float;
          continue;
        }
#endif
#ifdef GLX_ARB_framebuffer_sRGB
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"framebuffer_sRGB", 16))
        {
          ret = GLXEW_ARB_framebuffer_sRGB;
          continue;
        }
#endif
#ifdef GLX_ARB_get_proc_address
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"get_proc_address", 16))
        {
          ret = GLXEW_ARB_get_proc_address;
          continue;
        }
#endif
#ifdef GLX_ARB_multisample
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"multisample", 11))
        {
          ret = GLXEW_ARB_multisample;
          continue;
        }
#endif
#ifdef GLX_ARB_robustness_application_isolation
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"robustness_application_isolation", 32))
        {
          ret = GLXEW_ARB_robustness_application_isolation;
          continue;
        }
#endif
#ifdef GLX_ARB_robustness_share_group_isolation
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"robustness_share_group_isolation", 32))
        {
          ret = GLXEW_ARB_robustness_share_group_isolation;
          continue;
        }
#endif
#ifdef GLX_ARB_vertex_buffer_object
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"vertex_buffer_object", 20))
        {
          ret = GLXEW_ARB_vertex_buffer_object;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"ATI_", 4))
      {
#ifdef GLX_ATI_pixel_format_float
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"pixel_format_float", 18))
        {
          ret = GLXEW_ATI_pixel_format_float;
          continue;
        }
#endif
#ifdef GLX_ATI_render_texture
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"render_texture", 14))
        {
          ret = GLXEW_ATI_render_texture;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"EXT_", 4))
      {
#ifdef GLX_EXT_buffer_age
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"buffer_age", 10))
        {
          ret = GLXEW_EXT_buffer_age;
          continue;
        }
#endif
#ifdef GLX_EXT_create_context_es2_profile
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"create_context_es2_profile", 26))
        {
          ret = GLXEW_EXT_create_context_es2_profile;
          continue;
        }
#endif
#ifdef GLX_EXT_create_context_es_profile
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"create_context_es_profile", 25))
        {
          ret = GLXEW_EXT_create_context_es_profile;
          continue;
        }
#endif
#ifdef GLX_EXT_fbconfig_packed_float
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"fbconfig_packed_float", 21))
        {
          ret = GLXEW_EXT_fbconfig_packed_float;
          continue;
        }
#endif
#ifdef GLX_EXT_framebuffer_sRGB
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"framebuffer_sRGB", 16))
        {
          ret = GLXEW_EXT_framebuffer_sRGB;
          continue;
        }
#endif
#ifdef GLX_EXT_import_context
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"import_context", 14))
        {
          ret = GLXEW_EXT_import_context;
          continue;
        }
#endif
#ifdef GLX_EXT_scene_marker
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"scene_marker", 12))
        {
          ret = GLXEW_EXT_scene_marker;
          continue;
        }
#endif
#ifdef GLX_EXT_stereo_tree
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"stereo_tree", 11))
        {
          ret = GLXEW_EXT_stereo_tree;
          continue;
        }
#endif
#ifdef GLX_EXT_swap_control
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_control", 12))
        {
          ret = GLXEW_EXT_swap_control;
          continue;
        }
#endif
#ifdef GLX_EXT_swap_control_tear
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_control_tear", 17))
        {
          ret = GLXEW_EXT_swap_control_tear;
          continue;
        }
#endif
#ifdef GLX_EXT_texture_from_pixmap
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"texture_from_pixmap", 19))
        {
          ret = GLXEW_EXT_texture_from_pixmap;
          continue;
        }
#endif
#ifdef GLX_EXT_visual_info
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"visual_info", 11))
        {
          ret = GLXEW_EXT_visual_info;
          continue;
        }
#endif
#ifdef GLX_EXT_visual_rating
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"visual_rating", 13))
        {
          ret = GLXEW_EXT_visual_rating;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"INTEL_", 6))
      {
#ifdef GLX_INTEL_swap_event
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_event", 10))
        {
          ret = GLXEW_INTEL_swap_event;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"MESA_", 5))
      {
#ifdef GLX_MESA_agp_offset
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"agp_offset", 10))
        {
          ret = GLXEW_MESA_agp_offset;
          continue;
        }
#endif
#ifdef GLX_MESA_copy_sub_buffer
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"copy_sub_buffer", 15))
        {
          ret = GLXEW_MESA_copy_sub_buffer;
          continue;
        }
#endif
#ifdef GLX_MESA_pixmap_colormap
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"pixmap_colormap", 15))
        {
          ret = GLXEW_MESA_pixmap_colormap;
          continue;
        }
#endif
#ifdef GLX_MESA_query_renderer
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"query_renderer", 14))
        {
          ret = GLXEW_MESA_query_renderer;
          continue;
        }
#endif
#ifdef GLX_MESA_release_buffers
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"release_buffers", 15))
        {
          ret = GLXEW_MESA_release_buffers;
          continue;
        }
#endif
#ifdef GLX_MESA_set_3dfx_mode
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"set_3dfx_mode", 13))
        {
          ret = GLXEW_MESA_set_3dfx_mode;
          continue;
        }
#endif
#ifdef GLX_MESA_swap_control
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_control", 12))
        {
          ret = GLXEW_MESA_swap_control;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"NV_", 3))
      {
#ifdef GLX_NV_copy_buffer
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"copy_buffer", 11))
        {
          ret = GLXEW_NV_copy_buffer;
          continue;
        }
#endif
#ifdef GLX_NV_copy_image
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"copy_image", 10))
        {
          ret = GLXEW_NV_copy_image;
          continue;
        }
#endif
#ifdef GLX_NV_delay_before_swap
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"delay_before_swap", 17))
        {
          ret = GLXEW_NV_delay_before_swap;
          continue;
        }
#endif
#ifdef GLX_NV_float_buffer
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"float_buffer", 12))
        {
          ret = GLXEW_NV_float_buffer;
          continue;
        }
#endif
#ifdef GLX_NV_multisample_coverage
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"multisample_coverage", 20))
        {
          ret = GLXEW_NV_multisample_coverage;
          continue;
        }
#endif
#ifdef GLX_NV_present_video
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"present_video", 13))
        {
          ret = GLXEW_NV_present_video;
          continue;
        }
#endif
#ifdef GLX_NV_swap_group
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_group", 10))
        {
          ret = GLXEW_NV_swap_group;
          continue;
        }
#endif
#ifdef GLX_NV_vertex_array_range
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"vertex_array_range", 18))
        {
          ret = GLXEW_NV_vertex_array_range;
          continue;
        }
#endif
#ifdef GLX_NV_video_capture
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"video_capture", 13))
        {
          ret = GLXEW_NV_video_capture;
          continue;
        }
#endif
#ifdef GLX_NV_video_out
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"video_out", 9))
        {
          ret = GLXEW_NV_video_out;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"OML_", 4))
      {
#ifdef GLX_OML_swap_method
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_method", 11))
        {
          ret = GLXEW_OML_swap_method;
          continue;
        }
#endif
#ifdef GLX_OML_sync_control
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"sync_control", 12))
        {
          ret = GLXEW_OML_sync_control;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"SGIS_", 5))
      {
#ifdef GLX_SGIS_blended_overlay
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"blended_overlay", 15))
        {
          ret = GLXEW_SGIS_blended_overlay;
          continue;
        }
#endif
#ifdef GLX_SGIS_color_range
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"color_range", 11))
        {
          ret = GLXEW_SGIS_color_range;
          continue;
        }
#endif
#ifdef GLX_SGIS_multisample
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"multisample", 11))
        {
          ret = GLXEW_SGIS_multisample;
          continue;
        }
#endif
#ifdef GLX_SGIS_shared_multisample
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"shared_multisample", 18))
        {
          ret = GLXEW_SGIS_shared_multisample;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"SGIX_", 5))
      {
#ifdef GLX_SGIX_fbconfig
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"fbconfig", 8))
        {
          ret = GLXEW_SGIX_fbconfig;
          continue;
        }
#endif
#ifdef GLX_SGIX_hyperpipe
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"hyperpipe", 9))
        {
          ret = GLXEW_SGIX_hyperpipe;
          continue;
        }
#endif
#ifdef GLX_SGIX_pbuffer
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"pbuffer", 7))
        {
          ret = GLXEW_SGIX_pbuffer;
          continue;
        }
#endif
#ifdef GLX_SGIX_swap_barrier
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_barrier", 12))
        {
          ret = GLXEW_SGIX_swap_barrier;
          continue;
        }
#endif
#ifdef GLX_SGIX_swap_group
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_group", 10))
        {
          ret = GLXEW_SGIX_swap_group;
          continue;
        }
#endif
#ifdef GLX_SGIX_video_resize
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"video_resize", 12))
        {
          ret = GLXEW_SGIX_video_resize;
          continue;
        }
#endif
#ifdef GLX_SGIX_visual_select_group
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"visual_select_group", 19))
        {
          ret = GLXEW_SGIX_visual_select_group;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"SGI_", 4))
      {
#ifdef GLX_SGI_cushion
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"cushion", 7))
        {
          ret = GLXEW_SGI_cushion;
          continue;
        }
#endif
#ifdef GLX_SGI_make_current_read
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"make_current_read", 17))
        {
          ret = GLXEW_SGI_make_current_read;
          continue;
        }
#endif
#ifdef GLX_SGI_swap_control
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_control", 12))
        {
          ret = GLXEW_SGI_swap_control;
          continue;
        }
#endif
#ifdef GLX_SGI_video_sync
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"video_sync", 10))
        {
          ret = GLXEW_SGI_video_sync;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"SUN_", 4))
      {
#ifdef GLX_SUN_get_transparent_index
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"get_transparent_index", 21))
        {
          ret = GLXEW_SUN_get_transparent_index;
          continue;
        }
#endif
#ifdef GLX_SUN_video_resize
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"video_resize", 12))
        {
          ret = GLXEW_SUN_video_resize;
          continue;
        }
#endif
      }
    }
    ret = (len == 0);
  }
  return ret;
}